

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

void destroy_section(ALLEGRO_CONFIG_SECTION *s)

{
  ALLEGRO_CONFIG_ENTRY *pAVar1;
  ALLEGRO_CONFIG_ENTRY *e;
  
  e = s->head;
  while (e != (ALLEGRO_CONFIG_ENTRY *)0x0) {
    pAVar1 = e->next;
    destroy_entry(e);
    e = pAVar1;
  }
  al_ustr_free(s->name);
  _al_aa_free((Aatree *)s->tree);
  al_free_with_context
            (s,0x229,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/config.c"
             ,"destroy_section");
  return;
}

Assistant:

static void destroy_section(ALLEGRO_CONFIG_SECTION *s)
{
   ALLEGRO_CONFIG_ENTRY *e = s->head;
   while (e) {
      ALLEGRO_CONFIG_ENTRY *tmp = e->next;
      destroy_entry(e);
      e = tmp;
   }
   al_ustr_free(s->name);
   _al_aa_free(s->tree);
   al_free(s);
}